

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

void __thiscall cmELF::cmELF(cmELF *this,char *fname)

{
  string *this_00;
  _Head_base<0UL,_cmELFInternal_*,_false> _Var1;
  _Head_base<0UL,_cmELFInternal_*,_false> _Var2;
  uint uVar3;
  long *this_01;
  long *plVar4;
  char *pcVar5;
  pointer *__ptr;
  char ident [16];
  _Head_base<0UL,_cmELFInternal_*,_false> local_60;
  uint local_54;
  long *local_50;
  int local_48;
  char cStack_44;
  byte bStack_43;
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_30;
  
  (this->Internal)._M_t.super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>.
  _M_t.super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
  super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl = (cmELFInternal *)0x0;
  this_00 = &this->ErrorMessage;
  (this->ErrorMessage)._M_dataplus._M_p = (pointer)&(this->ErrorMessage).field_2;
  (this->ErrorMessage)._M_string_length = 0;
  (this->ErrorMessage).field_2._M_local_buf[0] = '\0';
  this_01 = (long *)operator_new(0x208);
  std::ifstream::ifstream(this_01,fname,_S_bin);
  local_50 = this_01;
  if ((*(byte *)((long)this_01 + *(long *)(*this_01 + -0x18) + 0x20) & 5) != 0) {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->ErrorMessage)._M_string_length,0x8cca10);
    goto LAB_004f9102;
  }
  plVar4 = (long *)std::istream::read((char *)this_01,(long)&local_48);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    plVar4 = (long *)std::istream::seekg(this_01,0,0);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      if (local_48 == 0x464c457f) {
        uVar3 = (uint)bStack_43;
        if (bStack_43 == 1) {
LAB_004f90b2:
          local_54 = uVar3;
          if (cStack_44 == '\x02') {
            local_30._M_t.
            super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                              )this;
            std::
            make_unique<cmELFInternalImpl<cmELFTypes64>,cmELF*,std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>,cmELFInternal::ByteOrderType&>
                      ((cmELF **)&local_60,&local_30,(ByteOrderType *)&local_50);
          }
          else {
            if (cStack_44 != '\x01') {
              pcVar5 = "ELF file class is not 32-bit or 64-bit.";
              goto LAB_004f9176;
            }
            local_30._M_t.
            super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                              )this;
            std::
            make_unique<cmELFInternalImpl<cmELFTypes32>,cmELF*,std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>,cmELFInternal::ByteOrderType&>
                      ((cmELF **)&local_60,&local_30,(ByteOrderType *)&local_50);
          }
          _Var2._M_head_impl = local_60._M_head_impl;
          local_60._M_head_impl = (cmELFInternal *)0x0;
          _Var1._M_head_impl =
               (this->Internal)._M_t.
               super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
               super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
               super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl;
          (this->Internal)._M_t.
          super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
          super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
          super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl = _Var2._M_head_impl;
          if ((_Var1._M_head_impl != (cmELFInternal *)0x0) &&
             ((**(code **)((long)(_Var1._M_head_impl)->_vptr_cmELFInternal + 8))(),
             local_60._M_head_impl != (cmELFInternal *)0x0)) {
            (*(local_60._M_head_impl)->_vptr_cmELFInternal[1])();
          }
        }
        else {
          if (bStack_43 == 2) {
            uVar3 = 0;
            goto LAB_004f90b2;
          }
          pcVar5 = "ELF file is not LSB or MSB encoded.";
LAB_004f9176:
          std::__cxx11::string::operator=((string *)this_00,pcVar5);
        }
        this_01 = local_50;
        if (local_50 == (long *)0x0) {
          return;
        }
        goto LAB_004f9102;
      }
      pcVar5 = "File does not have a valid ELF identification.";
    }
    else {
      pcVar5 = "Error seeking to beginning of file.";
    }
  }
  else {
    pcVar5 = "Error reading ELF identification.";
  }
  std::__cxx11::string::_M_replace
            ((ulong)this_00,0,(char *)(this->ErrorMessage)._M_string_length,(ulong)pcVar5);
LAB_004f9102:
  (**(code **)(*this_01 + 8))(this_01);
  return;
}

Assistant:

cmELF::cmELF(const char* fname)
{
  // Try to open the file.
  auto fin = cm::make_unique<cmsys::ifstream>(fname, std::ios::binary);

  // Quit now if the file could not be opened.
  if (!fin || !*fin) {
    this->ErrorMessage = "Error opening input file.";
    return;
  }

  // Read the ELF identification block.
  char ident[EI_NIDENT];
  if (!fin->read(ident, EI_NIDENT)) {
    this->ErrorMessage = "Error reading ELF identification.";
    return;
  }
  if (!fin->seekg(0)) {
    this->ErrorMessage = "Error seeking to beginning of file.";
    return;
  }

  // Verify the ELF identification.
  if (!(ident[EI_MAG0] == ELFMAG0 && ident[EI_MAG1] == ELFMAG1 &&
        ident[EI_MAG2] == ELFMAG2 && ident[EI_MAG3] == ELFMAG3)) {
    this->ErrorMessage = "File does not have a valid ELF identification.";
    return;
  }

  // Check the byte order in which the rest of the file is encoded.
  cmELFInternal::ByteOrderType order;
  if (ident[EI_DATA] == ELFDATA2LSB) {
    // File is LSB.
    order = cmELFInternal::ByteOrderLSB;
  } else if (ident[EI_DATA] == ELFDATA2MSB) {
    // File is MSB.
    order = cmELFInternal::ByteOrderMSB;
  } else {
    this->ErrorMessage = "ELF file is not LSB or MSB encoded.";
    return;
  }

  // Check the class of the file and construct the corresponding
  // parser implementation.
  if (ident[EI_CLASS] == ELFCLASS32) {
    // 32-bit ELF
    this->Internal = cm::make_unique<cmELFInternalImpl<cmELFTypes32>>(
      this, std::move(fin), order);
  } else if (ident[EI_CLASS] == ELFCLASS64) {
    // 64-bit ELF
    this->Internal = cm::make_unique<cmELFInternalImpl<cmELFTypes64>>(
      this, std::move(fin), order);
  } else {
    this->ErrorMessage = "ELF file class is not 32-bit or 64-bit.";
    return;
  }
}